

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodeUpdate(ImGuiDockNode *node)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  ImGuiWindow **ppIVar6;
  ImGuiViewportP *pIVar7;
  ImDrawList *pIVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ImGuiViewportFlags IVar15;
  ImGuiViewportFlags IVar16;
  ImGuiContext *pIVar17;
  ImGuiContext *pIVar18;
  ImGuiContext *pIVar19;
  bool bVar20;
  bool bVar21;
  ImU32 IVar22;
  ImGuiID IVar23;
  ImGuiID IVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  ImGuiWindow *pIVar28;
  ImGuiWindow *pIVar29;
  ImGuiTabItem *pIVar30;
  ImGuiID *pIVar31;
  float fVar32;
  long lVar33;
  ImGuiDockNode *pIVar34;
  ImGuiDockNode *pIVar35;
  char *pcVar36;
  char cVar37;
  ushort uVar38;
  short sVar39;
  uint uVar40;
  int iVar41;
  ImVec2 *pIVar42;
  ImGuiWindow *extraout_RDX;
  ImGuiWindow *extraout_RDX_00;
  ImGuiWindow *extraout_RDX_01;
  ImGuiWindow *extraout_RDX_02;
  ulong extraout_RDX_03;
  undefined8 extraout_RDX_04;
  ulong extraout_RDX_05;
  bool *p_open;
  uint uVar43;
  ulong uVar44;
  float fVar45;
  undefined8 unaff_R12;
  undefined8 uVar46;
  long lVar47;
  uint uVar48;
  ImGuiWindow *single_window;
  ImGuiTabBar *this;
  bool bVar49;
  float fVar50;
  float fVar51;
  ImRect outer;
  ImRect inner;
  ImRect title_bar_rect;
  char window_label [20];
  ImRect tab_bar_rect;
  ImRect local_c8;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  int local_a8;
  ulong local_98;
  ImGuiTabBar *local_90;
  uint local_84;
  uint local_80;
  uint local_7c;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  ImVec2 local_50;
  ImRect local_48;
  
  pIVar17 = GImGui;
  if (node->LastFrameActive == GImGui->FrameCount) {
    __assert_fail("node->LastFrameActive != g.FrameCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3285,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  node->LastFrameAlive = GImGui->FrameCount;
  node->field_0xba = node->field_0xba & 0xf7;
  node->CentralNode = (ImGuiDockNode *)0x0;
  node->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
  if (node->ParentNode == (ImGuiDockNode *)0x0) {
    DockNodeUpdateVisibleFlagAndInactiveChilds(node);
    local_b8._0_4_ = 0.0;
    local_b8._4_4_ = 0.0;
    uStack_b0 = (ImGuiDockNode *)0x0;
    local_a8 = 0;
    DockNodeFindInfo(node,(ImGuiDockNodeFindInfoResults *)local_b8);
    node->CentralNode = (ImGuiDockNode *)local_b8;
    pIVar34 = (ImGuiDockNode *)0x0;
    if (local_a8 == 1) {
      pIVar34 = uStack_b0;
    }
    node->OnlyNodeWithWindows = pIVar34;
    if (uStack_b0 == (ImGuiDockNode *)0x0 || node->LastFocusedNodeId != 0) {
      if (uStack_b0 == (ImGuiDockNode *)0x0) goto LAB_0013ac03;
    }
    else {
      node->LastFocusedNodeId = uStack_b0->ID;
    }
    if ((uStack_b0->Windows).Size < 1) goto LAB_0013c2fa;
    pIVar29 = *(uStack_b0->Windows).Data;
    IVar23 = (pIVar29->WindowClass).ClassId;
    IVar24 = (pIVar29->WindowClass).ParentViewportId;
    IVar15 = (pIVar29->WindowClass).ViewportFlagsOverrideSet;
    IVar16 = (pIVar29->WindowClass).ViewportFlagsOverrideClear;
    uVar46 = *(undefined8 *)((long)&(pIVar29->WindowClass).DockNodeFlagsOverrideSet + 2);
    *(undefined8 *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 2) =
         *(undefined8 *)((long)&(pIVar29->WindowClass).ViewportFlagsOverrideSet + 2);
    *(undefined8 *)((long)&(node->WindowClass).DockNodeFlagsOverrideSet + 2) = uVar46;
    (node->WindowClass).ClassId = IVar23;
    (node->WindowClass).ParentViewportId = IVar24;
    (node->WindowClass).ViewportFlagsOverrideSet = IVar15;
    (node->WindowClass).ViewportFlagsOverrideClear = IVar16;
    lVar33 = (long)(uStack_b0->Windows).Size;
    if (1 < lVar33) {
      lVar47 = 1;
      do {
        pIVar29 = (uStack_b0->Windows).Data[lVar47];
        if ((pIVar29->WindowClass).DockingAllowUnclassed == false) {
          IVar23 = (pIVar29->WindowClass).ClassId;
          IVar24 = (pIVar29->WindowClass).ParentViewportId;
          IVar15 = (pIVar29->WindowClass).ViewportFlagsOverrideSet;
          IVar16 = (pIVar29->WindowClass).ViewportFlagsOverrideClear;
          uVar46 = *(undefined8 *)((long)&(pIVar29->WindowClass).DockNodeFlagsOverrideSet + 2);
          *(undefined8 *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 2) =
               *(undefined8 *)((long)&(pIVar29->WindowClass).ViewportFlagsOverrideSet + 2);
          *(undefined8 *)((long)&(node->WindowClass).DockNodeFlagsOverrideSet + 2) = uVar46;
          (node->WindowClass).ClassId = IVar23;
          (node->WindowClass).ParentViewportId = IVar24;
          (node->WindowClass).ViewportFlagsOverrideSet = IVar15;
          (node->WindowClass).ViewportFlagsOverrideClear = IVar16;
          break;
        }
        lVar47 = lVar47 + 1;
      } while (lVar33 != lVar47);
    }
  }
LAB_0013ac03:
  if ((node->TabBar != (ImGuiTabBar *)0x0) && ((node->LocalFlags & 0x1000) != 0)) {
    IM_DELETE<ImGuiTabBar>(node->TabBar);
    node->TabBar = (ImGuiTabBar *)0x0;
  }
  uVar43 = (node->Windows).Size;
  uVar27 = (ulong)uVar43;
  if (((((int)uVar43 < 2) && (node->ParentNode == (ImGuiDockNode *)0x0)) &&
      ((node->LocalFlags & 0x400U) == 0)) &&
     ((node->ChildNodes[0] == (ImGuiDockNode *)0x0 &&
      ((pIVar17->IO).ConfigDockingAlwaysTabBar == false)))) {
    if (uVar43 == 0) goto LAB_0013afbb;
    if (uVar43 != 1) {
LAB_0013c2fa:
      pcVar36 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
LAB_0013c30f:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                    ,0x5c2,pcVar36);
    }
    pIVar29 = *(node->Windows).Data;
    if ((pIVar29->WindowClass).DockingAlwaysTabBar == false) {
      node->Pos = pIVar29->Pos;
      node->Size = pIVar29->SizeFull;
      *(ushort *)&node->field_0xb8 = (ushort)*(undefined4 *)&node->field_0xb8 & 0xfe00 | 0x92;
      pIVar28 = node->HostWindow;
      if (pIVar28 != (ImGuiWindow *)0x0) {
        if (pIVar17->NavWindow == pIVar28) {
          FocusWindow(pIVar29);
          pIVar28 = node->HostWindow;
          if (pIVar28 == (ImGuiWindow *)0x0) goto LAB_0013afbb;
        }
        pIVar7 = pIVar28->Viewport;
        pIVar29->Viewport = pIVar7;
        pIVar29->ViewportId = pIVar28->ViewportId;
        if (pIVar28->ViewportOwned == true) {
          pIVar7->Window = pIVar29;
          pIVar29->ViewportOwned = true;
        }
      }
LAB_0013afbb:
      DockNodeHideHostWindow(node);
      node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
      node->WantCloseTabId = 0;
      node->field_0xb9 = node->field_0xb9 & 0x87;
      node->LastFrameActive = pIVar17->FrameCount;
      if ((node->field_0xba & 1) == 0) {
        return;
      }
      if ((node->Windows).Size != 1) {
        return;
      }
      DockNodeStartMouseMovingWindow(node,*(node->Windows).Data);
      return;
    }
  }
  uVar40 = *(uint *)&node->field_0xb8;
  if ((((uVar40 >> 9 & 1) != 0) && (node->HostWindow == (ImGuiWindow *)0x0)) &&
     ((node->ParentNode == (ImGuiDockNode *)0x0 &&
      (((node->LocalFlags & 0x400U) == 0 && (node->ChildNodes[0] == (ImGuiDockNode *)0x0)))))) {
    if ((int)uVar43 < 1) {
      __assert_fail("node->Windows.Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,12999,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    ppIVar6 = (node->Windows).Data;
    if (node->SelectedTabId != 0) {
      uVar44 = 0;
      do {
        pIVar29 = ppIVar6[uVar44];
        if (pIVar29->ID == node->SelectedTabId) goto LAB_0013ae6d;
        uVar44 = uVar44 + 1;
      } while (uVar27 != uVar44);
    }
    pIVar29 = *ppIVar6;
LAB_0013ae6d:
    if (('\0' < pIVar29->AutoFitFramesX) || ('\0' < pIVar29->AutoFitFramesY)) {
      node->State = ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
      return;
    }
  }
  uVar26 = node->LocalFlags;
  pIVar29 = (ImGuiWindow *)(ulong)uVar26;
  uVar48 = node->SharedFlags | uVar26;
  if ((uVar26 >> 10 & 1) == 0) {
    uVar40 = (uint)((uVar48 >> 0xe & 1) == 0 && 0 < (int)uVar43) << 0xc |
             uVar40 & 0xffffc7ff | (uint)(-1 < (short)uVar48 && 0 < (int)uVar43) << 0xb;
    *(short *)&node->field_0xb8 = (short)uVar40;
    if ((int)uVar43 < 1) {
      bVar49 = false;
    }
    else {
      lVar33 = 0;
      do {
        pIVar29 = (node->Windows).Data[lVar33];
        pIVar29->field_0x492 = pIVar29->field_0x492 & 0xfe | 1 < (int)uVar27;
        iVar25._0_1_ = pIVar29->HasCloseButton;
        iVar25._1_1_ = pIVar29->ResizeBorderHeld;
        iVar25._2_2_ = pIVar29->BeginCount;
        uVar38 = (ushort)(iVar25 << 0xd) | *(ushort *)&node->field_0xb8;
        uVar40 = CONCAT22((short)((uint)(iVar25 << 0xd) >> 0x10),uVar38);
        *(ushort *)&node->field_0xb8 = uVar38;
        lVar33 = lVar33 + 1;
        iVar25 = (node->Windows).Size;
        uVar27 = (ulong)iVar25;
      } while (lVar33 < (long)uVar27);
      bVar49 = 0 < iVar25;
    }
    pIVar18 = GImGui;
    pIVar29 = (ImGuiWindow *)(ulong)uVar40;
    if (node->ParentNode == (ImGuiDockNode *)0x0) {
      if ((uVar40 >> 9 & 1) == 0) {
        uVar46 = 0;
        pIVar28 = (ImGuiWindow *)0x0;
      }
      else {
        if (bVar49) {
          pIVar29 = *(node->Windows).Data;
          bVar49 = pIVar29 != (ImGuiWindow *)0x0;
          if ((uVar40 & 7) != 2 || !bVar49) goto LAB_0013b026;
          pIVar42 = &pIVar29->Pos;
          bVar49 = true;
LAB_0013b035:
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
          (pIVar18->NextWindowData).PosVal = *pIVar42;
          (pIVar18->NextWindowData).PosPivotVal.x = 0.0;
          (pIVar18->NextWindowData).PosPivotVal.y = 0.0;
          (pIVar18->NextWindowData).PosCond = 1;
          (pIVar18->NextWindowData).PosUndock = true;
        }
        else {
          bVar49 = false;
          pIVar29 = (ImGuiWindow *)0x0;
LAB_0013b026:
          if ((uVar40 & 7) == 1) {
            pIVar42 = &node->Pos;
            goto LAB_0013b035;
          }
        }
        pIVar18 = GImGui;
        sVar39 = (short)((uint)(int)(short)(*(int *)&node->field_0xb8 << 10) >> 0xd);
        if ((sVar39 == 2) && (bVar49)) {
          pIVar42 = &pIVar29->SizeFull;
LAB_0013b092:
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
          (pIVar18->NextWindowData).SizeVal = *pIVar42;
          (pIVar18->NextWindowData).SizeCond = 1;
        }
        else if (sVar39 == 1) {
          pIVar42 = &node->Size;
          goto LAB_0013b092;
        }
        pIVar18 = GImGui;
        uVar38 = *(ushort *)&node->field_0xb8;
        if ((bool)((uVar38 & 0x38) == 0x10 & bVar49)) {
          bVar20 = pIVar29->Collapsed;
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 8;
          (pIVar18->NextWindowData).CollapsedVal = bVar20;
          (pIVar18->NextWindowData).CollapsedCond = 1;
          uVar38 = *(ushort *)&node->field_0xb8;
        }
        pIVar18 = GImGui;
        if ((bool)((uVar38 & 0x1c0) == 0x80 & bVar49)) {
          IVar23 = pIVar29->ViewportId;
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 0x100;
          (pIVar18->NextWindowData).ViewportId = IVar23;
        }
        SetNextWindowClass(&node->WindowClass);
        ImFormatString(local_b8,0x14,"##DockNode_%02X",(ulong)node->ID);
        local_c8.Min.x = 0.0;
        local_c8.Min.y = 0.0;
        PushStyleVar(1,&local_c8.Min);
        Begin(local_b8,(bool *)0x0,0x20081139);
        PopStyleVar(1);
        pIVar28 = pIVar17->CurrentWindow;
        node->HostWindow = pIVar28;
        pIVar28->DockNodeAsHost = node;
        IVar5 = pIVar28->Pos;
        (pIVar28->DC).CursorPos = IVar5;
        node->Pos = IVar5;
        node->Size = pIVar28->Size;
        pIVar29 = extraout_RDX;
        if (node->HostWindow->Appearing == true) {
          BringWindowToDisplayFront(node->HostWindow);
          pIVar29 = extraout_RDX_00;
        }
        *(ushort *)&node->field_0xb8 = *(ushort *)&node->field_0xb8 & 0xfe00;
        uVar46 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
      }
    }
    else {
      pIVar28 = node->ParentNode->HostWindow;
      node->HostWindow = pIVar28;
      pIVar29 = (ImGuiWindow *)(ulong)(uVar40 & 0xfe00);
      *(short *)&node->field_0xb8 = (short)(uVar40 & 0xfe00);
      uVar46 = 0;
    }
    if (((node->field_0xba & 1) != 0) && (node->HostWindow != (ImGuiWindow *)0x0)) {
      DockNodeStartMouseMovingWindow(node,node->HostWindow);
      pIVar29 = extraout_RDX_01;
    }
  }
  else {
    pIVar28 = node->HostWindow;
    if (pIVar28 == (ImGuiWindow *)0x0) {
      __assert_fail("node->HostWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x32dc,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    *(ushort *)&node->field_0xb8 =
         ((ushort)(uVar48 >> 2) & 0x1000 | (ushort)uVar40 & 0xc7ff | (ushort)(uVar48 >> 4) & 0x800)
         ^ 0x1800;
    uVar46 = 0;
  }
  if ((node->ChildNodes[0] != (ImGuiDockNode *)0x0) && (node->TabBar != (ImGuiTabBar *)0x0)) {
    __assert_fail("node->TabBar == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3333,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  local_58 = uVar46;
  if (node->ParentNode == (ImGuiDockNode *)0x0) {
    if (pIVar17->NavWindow != (ImGuiWindow *)0x0) {
      pIVar29 = pIVar17->NavWindow->RootWindowDockStop;
      if ((pIVar29->DockNode != (ImGuiDockNode *)0x0) && (pIVar29->ParentWindow == pIVar28)) {
        node->LastFocusedNodeId = pIVar29->DockNode->ID;
      }
    }
    if (pIVar28 == (ImGuiWindow *)0x0) {
      uVar27 = 0;
      goto LAB_0013b222;
    }
    uVar43 = uVar48 >> 3 & 1;
    cVar37 = (char)uVar43;
    if (uVar43 == 0) {
      pIVar34 = node->CentralNode;
LAB_0013b890:
      pIVar18 = GImGui;
      uVar27 = CONCAT71((int7)((ulong)pIVar29 >> 8),1);
      if ((pIVar34 != (ImGuiDockNode *)0x0 & (byte)uVar48 >> 3) == 1) {
        bVar49 = false;
        if ((pIVar34->ChildNodes[0] != (ImGuiDockNode *)0x0) || ((pIVar34->Windows).Size != 0))
        goto LAB_0013b22a;
        if ((GImGui->DragDropActive == true) &&
           (((GImGui->DragDropPayload).DataFrameCount != -1 &&
            (iVar25 = strcmp("_IMWINDOW",(GImGui->DragDropPayload).DataType),
            uVar27 = extraout_RDX_03, iVar25 == 0)))) {
          bVar49 = DockNodeIsDropAllowed(pIVar28,*(pIVar18->DragDropPayload).Data);
          uVar27 = CONCAT71((int7)((ulong)extraout_RDX_04 >> 8),1);
          if (!bVar49) goto LAB_0013b91a;
        }
        else {
LAB_0013b91a:
          if ((node->LocalFlags & 0x400) == 0) {
            __assert_fail("node->IsDockSpace()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                          ,0x334c,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
          }
          fVar51 = (pIVar34->Pos).x;
          fVar45 = (pIVar34->Pos).y;
          local_b8._0_4_ = fVar51 + 4.0;
          local_b8._4_4_ = fVar45 + 4.0;
          fVar51 = (pIVar34->Size).x + fVar51 + -4.0;
          fVar45 = (pIVar34->Size).y + fVar45 + -4.0;
          uStack_b0 = (ImGuiDockNode *)CONCAT44(fVar45,fVar51);
          if (((float)local_b8._0_4_ <= fVar51) && ((float)local_b8._4_4_ <= fVar45)) {
            local_c8.Min.x = fVar51 - (float)local_b8._0_4_;
            local_c8.Min.y = fVar45 - (float)local_b8._4_4_;
            SetWindowHitTestHole(pIVar28,(ImVec2 *)local_b8,&local_c8.Min);
            local_c8.Min.x = SUB84(uStack_b0,0) - local_b8._0_4_;
            local_c8.Min.y = (float)((ulong)uStack_b0 >> 0x20) - local_b8._4_4_;
            SetWindowHitTestHole(pIVar28->ParentWindow,(ImVec2 *)local_b8,&local_c8.Min);
            uVar27 = extraout_RDX_05;
          }
          uVar27 = CONCAT71((int7)(uVar27 >> 8),1);
        }
        bVar49 = true;
        goto LAB_0013b22a;
      }
      goto LAB_0013b227;
    }
    ImDrawListSplitter::Split(&pIVar28->DrawList->_Splitter,pIVar28->DrawList,2);
    ImDrawListSplitter::SetCurrentChannel(&pIVar28->DrawList->_Splitter,pIVar28->DrawList,1);
    pIVar34 = node->CentralNode;
    pIVar29 = extraout_RDX_02;
    if (node->ParentNode == (ImGuiDockNode *)0x0) goto LAB_0013b890;
    bVar49 = false;
    uVar27 = CONCAT71((int7)((ulong)extraout_RDX_02 >> 8),1);
    cVar37 = '\x01';
  }
  else {
    uVar27 = CONCAT71((int7)((ulong)pIVar29 >> 8),pIVar28 != (ImGuiWindow *)0x0);
LAB_0013b222:
    pIVar34 = node->CentralNode;
    cVar37 = '\0';
LAB_0013b227:
    bVar49 = false;
  }
LAB_0013b22a:
  if ((node->ParentNode == (ImGuiDockNode *)0x0) && ((char)uVar27 != '\0')) {
    uVar27 = uVar27 & 0xffffffff;
    DockNodeTreeUpdatePosSize(node,pIVar28->Pos,pIVar28->Size,false);
    DockNodeTreeUpdateSplitter(node);
  }
  if (((((char)uVar27 != '\0') && (node->ChildNodes[0] == (ImGuiDockNode *)0x0)) &&
      ((node->Windows).Size == 0)) &&
     (((uVar48 & 8) == 0 && ((*(ushort *)&node->field_0xb8 & 0x200) != 0)))) {
    pIVar8 = pIVar28->DrawList;
    local_c8.Min.x = (node->Size).x + (node->Pos).x;
    local_c8.Min.y = (node->Size).y + (node->Pos).y;
    local_b8 = *(undefined1 (*) [8])((GImGui->Style).Colors + 0x27);
    uVar9 = (GImGui->Style).Colors[0x27].z;
    uVar10 = (GImGui->Style).Colors[0x27].w;
    uStack_b0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * (float)uVar10,uVar9);
    IVar22 = ColorConvertFloat4ToU32((ImVec4 *)local_b8);
    ImDrawList::AddRectFilled(pIVar8,&node->Pos,&local_c8.Min,IVar22,0.0,0xf);
    uVar27 = uVar27 & 0xffffffff;
  }
  if ((cVar37 != '\0') && ((node->field_0xb9 & 2) != 0)) {
    ImDrawListSplitter::SetCurrentChannel(&pIVar28->DrawList->_Splitter,pIVar28->DrawList,0);
    pIVar8 = pIVar28->DrawList;
    if (bVar49) {
      IVar5 = node->Pos;
      outer.Max.x = (node->Size).x + IVar5.x;
      outer.Max.y = (node->Size).y + IVar5.y;
      local_78 = (pIVar34->Pos).x;
      fStack_74 = (pIVar34->Pos).y;
      uStack_70 = 0;
      local_68.y = (pIVar34->Size).y + fStack_74;
      local_68.x = (pIVar34->Size).x + local_78;
      uStack_60 = 0;
      local_b8 = *(undefined1 (*) [8])((GImGui->Style).Colors + 2);
      uVar11 = (GImGui->Style).Colors[2].z;
      uVar12 = (GImGui->Style).Colors[2].w;
      uStack_b0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * (float)uVar12,uVar11);
      IVar22 = ColorConvertFloat4ToU32((ImVec4 *)local_b8);
      inner.Min.y = fStack_74;
      inner.Min.x = local_78;
      outer.Min = IVar5;
      inner.Max = local_68;
      RenderRectFilledWithHole(pIVar8,outer,inner,IVar22,0.0);
    }
    else {
      local_c8.Min.x = (node->Size).x + (node->Pos).x;
      local_c8.Min.y = (node->Size).y + (node->Pos).y;
      local_b8 = *(undefined1 (*) [8])((GImGui->Style).Colors + 2);
      uVar13 = (GImGui->Style).Colors[2].z;
      uVar14 = (GImGui->Style).Colors[2].w;
      uStack_b0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * (float)uVar14,uVar13);
      IVar22 = ColorConvertFloat4ToU32((ImVec4 *)local_b8);
      ImDrawList::AddRectFilled(pIVar8,&node->Pos,&local_c8.Min,IVar22,0.0,0xf);
    }
    ImDrawListSplitter::Merge(&pIVar28->DrawList->_Splitter,pIVar28->DrawList);
    uVar27 = uVar27 & 0xffffffff;
  }
  pIVar18 = GImGui;
  if ((char)uVar27 == '\0') {
    uVar38 = *(ushort *)&node->field_0xb8;
LAB_0013b5c5:
    node->WantCloseTabId = 0;
    *(ushort *)&node->field_0xb8 = uVar38 & 0xbbff;
LAB_0013b5dc:
    cVar37 = (char)uVar27;
    if ((node->TabBar == (ImGuiTabBar *)0x0) || (IVar23 = node->TabBar->SelectedTabId, IVar23 == 0))
    goto LAB_0013b5ec;
  }
  else {
    uVar38 = *(ushort *)&node->field_0xb8;
    if ((node->Windows).Size < 1) goto LAB_0013b5c5;
    IVar23 = node->WantCloseTabId;
    fVar51 = (float)GImGui->FrameCount;
    *(ushort *)&node->field_0xb8 = uVar38 & 0xbfff;
    node->WantCloseTabId = 0;
    pIVar34 = node;
    do {
      pIVar35 = pIVar34;
      pIVar34 = pIVar35->ParentNode;
    } while (pIVar35->ParentNode != (ImGuiDockNode *)0x0);
    fVar45 = (float)(node->LastFrameActive + 1);
    if (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0) {
      if ((pIVar18->NavWindow != (ImGuiWindow *)0x0) &&
         (pIVar18->NavWindow->RootWindowForTitleBarHighlight == pIVar28->RootWindow)) {
        bVar49 = pIVar35->LastFocusedNodeId == node->ID;
        goto LAB_0013b5b1;
      }
      uVar43 = 0;
    }
    else {
      bVar49 = pIVar18->NavWindowingTarget->DockNode == node;
LAB_0013b5b1:
      uVar43 = (uint)bVar49;
    }
    if ((node->LocalFlags & 0x3000U) == 0) {
      local_68.x = fVar45;
      local_7c = (uint)uVar27;
      bVar49 = pIVar28->SkipItems;
      if (((uint)node->LocalFlags >> 10 & 1) == 0) {
        pIVar28->SkipItems = false;
        (pIVar28->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
      }
      local_84 = (uint)uVar38;
      local_78 = fVar51;
      PushOverrideID(node->ID);
      this = node->TabBar;
      local_90 = this;
      if (this == (ImGuiTabBar *)0x0) {
        DockNodeAddTabBar(node);
        this = node->TabBar;
      }
      *(ushort *)&node->field_0xb8 =
           (ushort)*(undefined4 *)&node->field_0xb8 & 0xfbff | (ushort)(uVar43 << 10);
      local_80 = node->LocalFlags | node->SharedFlags;
      if ((local_80 >> 0xe & 1) == 0) {
        if ((pIVar18->Style).WindowMenuButtonPosition == -1) {
          bVar20 = false;
          uVar27 = 0;
        }
        else {
          uVar27 = 0;
          IVar24 = ImGuiWindow::GetID(GImGui->CurrentWindow,"#WindowMenu",(char *)0x0);
          bVar20 = IsPopupOpen(IVar24,0);
          pIVar19 = GImGui;
          if (bVar20) {
            fVar50 = (node->Pos).x;
            bVar20 = true;
            if ((GImGui->Style).WindowMenuButtonPosition == 0) {
              fVar32 = 0.0;
            }
            else {
              fVar50 = fVar50 + (node->Size).x;
              fVar32 = 1.0;
            }
            fVar2 = (GImGui->Style).FramePadding.y;
            fVar3 = GImGui->FontSize;
            fVar4 = (node->Pos).y;
            (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
            (pIVar19->NextWindowData).PosVal.x = fVar50;
            (pIVar19->NextWindowData).PosVal.y = fVar2 + fVar2 + fVar3 + fVar4;
            (pIVar19->NextWindowData).PosPivotVal.x = fVar32;
            (pIVar19->NextWindowData).PosPivotVal.y = 0.0;
            (pIVar19->NextWindowData).PosCond = 1;
            (pIVar19->NextWindowData).PosUndock = true;
            bVar21 = BeginPopup("#WindowMenu",0);
            uVar27 = 0;
            if (bVar21) {
              node->field_0xb9 = node->field_0xb9 | 4;
              iVar25 = (this->Tabs).Size;
              if (iVar25 == 1) {
                bVar21 = MenuItem("Hide tab bar",(char *)0x0,
                                  (bool)((byte)((uint)node->LocalFlags >> 0xd) & 1),true);
                if (bVar21) {
                  node->field_0xba = node->field_0xba | 4;
                }
              }
              else if (0 < iVar25) {
                lVar47 = 0;
                lVar33 = 0;
                local_98 = 0;
                do {
                  pIVar30 = (this->Tabs).Data;
                  if ((*(byte *)((long)&pIVar30->Flags + lVar47 + 2) & 0x20) == 0) {
                    pIVar30 = (ImGuiTabItem *)((long)&pIVar30->ID + lVar47);
                    pcVar36 = ImGuiTabBar::GetTabName(this,pIVar30);
                    local_b8._0_4_ = 0.0;
                    local_b8._4_4_ = 0.0;
                    bVar21 = Selectable(pcVar36,pIVar30->ID == this->SelectedTabId,0,
                                        (ImVec2 *)local_b8);
                    pIVar19 = GImGui;
                    if (bVar21) {
                      local_98 = (ulong)pIVar30->ID;
                    }
                    pIVar29 = GImGui->CurrentWindow;
                    pIVar29->WriteAccessed = true;
                    if (pIVar29->SkipItems == false) {
                      (pIVar29->DC).CursorPos.x =
                           (pIVar19->Style).ItemSpacing.x + (pIVar29->DC).CursorPosPrevLine.x;
                      (pIVar29->DC).CursorPos.y = (pIVar29->DC).CursorPosPrevLine.y;
                      (pIVar29->DC).CurrLineSize = (pIVar29->DC).PrevLineSize;
                      (pIVar29->DC).CurrLineTextBaseOffset = (pIVar29->DC).PrevLineTextBaseOffset;
                    }
                    Text("   ");
                    iVar25 = (this->Tabs).Size;
                  }
                  lVar33 = lVar33 + 1;
                  lVar47 = lVar47 + 0x30;
                } while (lVar33 < iVar25);
                EndPopup();
                if ((ImGuiID)local_98 == 0) {
                  uVar27 = 0;
                }
                else {
                  this->NextSelectedTabId = (ImGuiID)local_98;
                  uVar27 = local_98;
                }
                goto LAB_0013bba5;
              }
              EndPopup();
            }
LAB_0013bba5:
            uVar43 = (uint)(byte)((byte)uVar43 | (node->field_0xb9 & 4) >> 2);
          }
          else {
            bVar20 = true;
          }
        }
      }
      else {
        bVar20 = false;
        uVar27 = 0;
      }
      local_c8.Min.x = 0.0;
      local_c8.Min.y = 0.0;
      local_c8.Max.x = 0.0;
      local_c8.Max.y = 0.0;
      local_48.Min.x = 0.0;
      local_48.Min.y = 0.0;
      local_48.Max.x = 0.0;
      local_48.Max.y = 0.0;
      local_50.x = 0.0;
      local_50.y = 0.0;
      DockNodeCalcTabBarLayout(node,&local_c8,&local_48,&local_50);
      iVar25 = 10;
      if ((char)uVar43 != '\0') {
        node->LastFrameFocused = pIVar18->FrameCount;
        iVar25 = 0xb;
      }
      iVar41 = 0xc;
      if (pIVar28->Collapsed == false) {
        iVar41 = iVar25;
      }
      pIVar42 = (ImVec2 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar41 << 4));
      local_b8 = *(undefined1 (*) [8])pIVar42;
      IVar5 = pIVar42[1];
      uStack_b0._4_4_ = IVar5.y;
      uStack_b0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * uStack_b0._4_4_,IVar5.x);
      IVar22 = ColorConvertFloat4ToU32((ImVec4 *)local_b8);
      ImDrawList::AddRectFilled
                (pIVar28->DrawList,&local_c8.Min,&local_c8.Max,IVar22,pIVar28->WindowRounding,3);
      if (bVar20) {
        IVar24 = ImGuiWindow::GetID(pIVar28,"#COLLAPSE",(char *)0x0);
        bVar20 = CollapseButton(IVar24,&local_50,node);
        if (bVar20) {
          IVar24 = ImGuiWindow::GetID(GImGui->CurrentWindow,"#WindowMenu",(char *)0x0);
          OpenPopupEx(IVar24,0);
        }
        if ((GImGui->ActiveId != 0) && (GImGui->ActiveId == (GImGui->CurrentWindow->DC).LastItemId))
        {
          uVar27 = (ulong)this->SelectedTabId;
        }
      }
      uVar40 = (this->Tabs).Size;
      uVar26 = uVar40;
      local_98 = uVar27;
      if (0 < (node->Windows).Size) {
        lVar33 = 0;
        do {
          pIVar29 = (node->Windows).Data[lVar33];
          if ((pIVar18->NavWindow != (ImGuiWindow *)0x0) &&
             (pIVar18->NavWindow->RootWindowDockStop == pIVar29)) {
            this->SelectedTabId = pIVar29->ID;
          }
          pIVar30 = TabBarFindTabByID(this,pIVar29->ID);
          if (pIVar30 == (ImGuiTabItem *)0x0) {
            TabBarAddTab(this,0x400000,pIVar29);
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 < (node->Windows).Size);
        uVar26 = (this->Tabs).Size;
      }
      uVar27 = (ulong)uVar26;
      if (0 < (int)uVar26) {
        lVar33 = (ulong)uVar26 * 0x30 + -0x2c;
        uVar27 = (ulong)uVar26;
        do {
          if ((long)(this->Tabs).Size < (long)uVar27) {
            pcVar36 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
            goto LAB_0013c30f;
          }
          pIVar30 = (this->Tabs).Data;
          uVar48 = *(uint *)((long)&pIVar30->ID + lVar33);
          if ((uVar48 >> 0x16 & 1) == 0) goto LAB_0013bdb5;
          *(uint *)((long)&pIVar30->ID + lVar33) = uVar48 & 0xffbfffff;
          lVar33 = lVar33 + -0x30;
          bVar20 = 1 < uVar27;
          uVar27 = uVar27 - 1;
        } while (bVar20);
        uVar27 = 0;
      }
LAB_0013bdb5:
      iVar25 = (int)uVar27;
      if ((uVar26 - iVar25 != 0 && iVar25 <= (int)uVar26) && (iVar25 + 1 < (int)uVar26)) {
        qsort((this->Tabs).Data + iVar25,(long)(int)(uVar26 - iVar25),0x30,
              TabItemComparerByDockOrder);
      }
      if ((local_90 == (ImGuiTabBar *)0x0) &&
         (pIVar30 = TabBarFindTabByID(this,node->SelectedTabId), pIVar30 != (ImGuiTabItem *)0x0)) {
        pIVar31 = &node->SelectedTabId;
LAB_0013be2e:
        IVar24 = *pIVar31;
        this->NextSelectedTabId = IVar24;
        this->SelectedTabId = IVar24;
      }
      else {
        uVar26 = (this->Tabs).Size;
        if ((int)uVar40 < (int)uVar26) {
          if ((int)uVar26 < 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                          ,0x5cc,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
          }
          pIVar31 = &((this->Tabs).Data[(ulong)uVar26 - 1].Window)->ID;
          goto LAB_0013be2e;
        }
      }
      uVar40 = uVar43 << 0x15 | 0x500003;
      if (pIVar28->Collapsed != false) {
        uVar40 = 0x500003;
      }
      BeginTabBarEx(this,&local_48,uVar40,node);
      node->VisibleWindow = (ImGuiWindow *)0x0;
      iVar25 = (node->Windows).Size;
      if (0 < iVar25) {
        uVar40 = local_84 >> 0xe;
        local_90 = (ImGuiTabBar *)&(pIVar28->DC).LastItemRect;
        lVar33 = 0;
        fVar50 = local_68.x;
        fVar32 = local_78;
        do {
          pIVar29 = (node->Windows).Data[lVar33];
          if (((((((byte)uVar40 & fVar45 == fVar51) == 0) &&
                (pIVar29->ID != (uint)(IVar23 != 0 && fVar45 == fVar51))) ||
               (pIVar29->HasCloseButton != true)) || ((pIVar29->Flags & 0x100000) != 0)) &&
             (pIVar18->FrameCount <= pIVar29->LastFrameActive + 1 || fVar50 != fVar32)) {
            local_b8[0] = 1;
            p_open = (bool *)0x0;
            if (pIVar29->HasCloseButton != false) {
              p_open = (bool *)local_b8;
            }
            TabItemEx(this,pIVar29->Name,p_open,
                      (uint)this->Flags >> 1 & 4 | (uint)pIVar29->Flags >> 0x14 & 1,pIVar29);
            IVar24 = pIVar29->ID;
            if ((bool)local_b8[0] == false) {
              node->WantCloseTabId = IVar24;
            }
            if (this->VisibleTabId == IVar24) {
              node->VisibleWindow = pIVar29;
            }
            pIVar29->DockTabItemStatusFlags = (pIVar28->DC).LastItemStatusFlags;
            iVar25 = (local_90->Tabs).Capacity;
            IVar5 = (ImVec2)(local_90->Tabs).Data;
            (pIVar29->DockTabItemRect).Min.x = (float)(local_90->Tabs).Size;
            (pIVar29->DockTabItemRect).Min.y = (float)iVar25;
            (pIVar29->DockTabItemRect).Max = IVar5;
            if (((pIVar18->NavWindow != (ImGuiWindow *)0x0) &&
                (pIVar18->NavWindow->RootWindowDockStop == pIVar29)) &&
               (((pIVar29->DC).NavLayerActiveMask & 2) == 0)) {
              pIVar28->NavLastIds[1] = IVar24;
            }
            iVar25 = (node->Windows).Size;
            fVar50 = local_68.x;
            fVar32 = local_78;
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 < iVar25);
        if ((node->VisibleWindow != (ImGuiWindow *)0x0) &&
           (((char)uVar43 != '\0' || (pIVar35->VisibleWindow == (ImGuiWindow *)0x0)))) {
          pIVar35->VisibleWindow = node->VisibleWindow;
        }
      }
      IVar23 = (ImGuiID)local_98;
      if ((-1 < (short)local_80) && (node->VisibleWindow != (ImGuiWindow *)0x0)) {
        if (node->VisibleWindow->HasCloseButton == false) {
          PushItemFlag(4,true);
          local_b8._0_4_ = (pIVar18->Style).Colors[0].x;
          local_b8._4_4_ = (pIVar18->Style).Colors[0].y;
          uStack_b0 = (ImGuiDockNode *)
                      CONCAT44((pIVar18->Style).Colors[0].w * 0.5,(pIVar18->Style).Colors[0].z);
          PushStyleColor(0,(ImVec4 *)local_b8);
        }
        fVar51 = pIVar18->FontSize;
        IVar24 = ImGuiWindow::GetID(pIVar28,"#CLOSE",(char *)0x0);
        fVar45 = (pIVar18->Style).FramePadding.x;
        local_b8._4_4_ = local_c8.Min.y + 0.0;
        local_b8._0_4_ = local_c8.Max.x + ((-fVar45 - fVar45) - fVar51);
        bVar20 = CloseButton(IVar24,(ImVec2 *)local_b8);
        if ((bVar20) &&
           (pIVar30 = TabBarFindTabByID(this,this->VisibleTabId), pIVar30 != (ImGuiTabItem *)0x0)) {
          node->WantCloseTabId = pIVar30->ID;
          TabBarCloseTab(this,pIVar30);
        }
        if (node->VisibleWindow->HasCloseButton == false) {
          PopStyleColor(1);
          PopItemFlag();
        }
      }
      IVar24 = ImGuiWindow::GetID(pIVar28,"#TITLEBAR",(char *)0x0);
      if (((pIVar18->HoveredId == 0) || (pIVar18->HoveredId == IVar24)) ||
         (pIVar18->ActiveId == IVar24)) {
        ButtonBehavior(&local_c8,IVar24,(bool *)0x0,(bool *)local_b8,0x1000);
        if (pIVar18->HoveredId == IVar24) {
          (pIVar28->DC).LastItemId = IVar24;
          pIVar18 = GImGui;
          IVar24 = (GImGui->CurrentWindow->DC).LastItemId;
          if (GImGui->HoveredId == IVar24) {
            GImGui->HoveredIdAllowOverlap = true;
          }
          if (pIVar18->ActiveId == IVar24) {
            pIVar18->ActiveIdAllowOverlap = true;
          }
        }
        if ((bool)local_b8[0] == true) {
          pfVar1 = (GImGui->IO).MouseDownDuration;
          IVar24 = this->SelectedTabId;
          if (*pfVar1 != 0.0) {
            IVar24 = IVar23;
          }
          if (NAN(*pfVar1)) {
            IVar24 = IVar23;
          }
          pIVar30 = TabBarFindTabByID(this,this->SelectedTabId);
          IVar23 = IVar24;
          if (pIVar30 != (ImGuiTabItem *)0x0) {
            pIVar29 = pIVar30->Window;
            if (pIVar29 == (ImGuiWindow *)0x0) {
              pIVar29 = node->HostWindow;
            }
            StartMouseMovingWindowOrNode(pIVar29,node,false);
          }
        }
      }
      if (this->NextSelectedTabId != 0) {
        IVar23 = this->NextSelectedTabId;
      }
      if (((IVar23 != 0) &&
          (pIVar30 = TabBarFindTabByID(this,IVar23), pIVar30 != (ImGuiTabItem *)0x0)) &&
         (pIVar30->Window != (ImGuiWindow *)0x0)) {
        FocusWindow(pIVar30->Window);
        NavInitWindow(pIVar30->Window,false);
      }
      EndTabBar();
      PopID();
      if ((node->LocalFlags & 0x400) == 0) {
        (pIVar28->DC).NavLayerCurrent = ImGuiNavLayer_Main;
        pIVar28->SkipItems = bVar49;
      }
      uVar27 = (ulong)local_7c;
      goto LAB_0013b5dc;
    }
    pIVar29 = *(node->Windows).Data;
    node->VisibleWindow = pIVar29;
    *(ushort *)&node->field_0xb8 = uVar38 & 0xbbff | (ushort)(uVar43 << 10);
    if ((byte)uVar43 == 0) {
      if (pIVar29 != (ImGuiWindow *)0x0) {
        if (pIVar35->VisibleWindow == (ImGuiWindow *)0x0) goto LAB_0013b851;
        goto LAB_0013b858;
      }
      goto LAB_0013b5dc;
    }
    node->LastFrameFocused = pIVar18->FrameCount;
    if (pIVar29 == (ImGuiWindow *)0x0) goto LAB_0013b5dc;
LAB_0013b851:
    pIVar35->VisibleWindow = pIVar29;
LAB_0013b858:
    if (node->TabBar != (ImGuiTabBar *)0x0) {
      node->TabBar->VisibleTabId = node->VisibleWindow->ID;
      goto LAB_0013b5dc;
    }
LAB_0013b5ec:
    cVar37 = (char)uVar27;
    if ((node->Windows).Size < 1) goto LAB_0013b602;
    IVar23 = (*(node->Windows).Data)->ID;
  }
  node->SelectedTabId = IVar23;
LAB_0013b602:
  if (cVar37 == '\0') {
    node->LastFrameActive = pIVar17->FrameCount;
  }
  else {
    if ((((node->field_0xb9 & 2) != 0) && (node->ParentNode == (ImGuiDockNode *)0x0)) &&
       ((pIVar17->MovingWindow == (ImGuiWindow *)0x0 ||
        (pIVar17->MovingWindow->RootWindow != pIVar28)))) {
      BeginDockableDragDropTarget(pIVar28);
    }
    node->LastFrameActive = pIVar17->FrameCount;
    if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      DockNodeUpdate(node->ChildNodes[0]);
    }
    if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
      DockNodeUpdate(node->ChildNodes[1]);
    }
    if (node->ParentNode == (ImGuiDockNode *)0x0) {
      RenderWindowOuterBorders(pIVar28);
    }
  }
  if ((char)local_58 != '\0') {
    End();
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdate(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->LastFrameActive != g.FrameCount);
    node->LastFrameAlive = g.FrameCount;
    node->MarkedForPosSizeWrite = false;

    node->CentralNode = node->OnlyNodeWithWindows = NULL;
    if (node->IsRootNode())
        DockNodeUpdateForRootNode(node);

    // Remove tab bar if not needed
    if (node->TabBar && node->IsNoTabBar())
        DockNodeRemoveTabBar(node);

    // Early out for hidden root dock nodes (when all DockId references are in inactive windows, or there is only 1 floating window holding on the DockId)
    bool want_to_hide_host_window = false;
    if (node->Windows.Size <= 1 && node->IsFloatingNode() && node->IsLeafNode())
        if (!g.IO.ConfigDockingAlwaysTabBar && (node->Windows.Size == 0 || !node->Windows[0]->WindowClass.DockingAlwaysTabBar))
            want_to_hide_host_window = true;
    if (want_to_hide_host_window)
    {
        if (node->Windows.Size == 1)
        {
            // Floating window pos/size is authoritative
            ImGuiWindow* single_window = node->Windows[0];
            node->Pos = single_window->Pos;
            node->Size = single_window->SizeFull;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Window;

            // Transfer focus immediately so when we revert to a regular window it is immediately selected
            if (node->HostWindow && g.NavWindow == node->HostWindow)
                FocusWindow(single_window);
            if (node->HostWindow)
            {
                single_window->Viewport = node->HostWindow->Viewport;
                single_window->ViewportId = node->HostWindow->ViewportId;
                if (node->HostWindow->ViewportOwned)
                {
                    single_window->Viewport->Window = single_window;
                    single_window->ViewportOwned = true;
                }
            }
        }

        DockNodeHideHostWindow(node);
        node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->HasCloseButton = node->HasWindowMenuButton = node->EnableCloseButton = false;
        node->LastFrameActive = g.FrameCount;

        if (node->WantMouseMove && node->Windows.Size == 1)
            DockNodeStartMouseMovingWindow(node, node->Windows[0]);
        return;
    }

    // In some circumstance we will defer creating the host window (so everything will be kept hidden),
    // while the expected visible window is resizing itself.
    // This is important for first-time (no ini settings restored) single window when io.ConfigDockingAlwaysTabBar is enabled,
    // otherwise the node ends up using the minimum window size. Effectively those windows will take an extra frame to show up:
    //   N+0: Begin(): window created (with no known size), node is created
    //   N+1: DockNodeUpdate(): node skip creating host window / Begin(): window size applied, not visible
    //   N+2: DockNodeUpdate(): node can create host window / Begin(): window becomes visible
    // We could remove this frame if we could reliably calculate the expected window size during node update, before the Begin() code.
    // It would require a generalization of CalcWindowExpectedSize(), probably extracting code away from Begin().
    // In reality it isn't very important as user quickly ends up with size data in .ini file.
    if (node->IsVisible && node->HostWindow == NULL && node->IsFloatingNode() && node->IsLeafNode())
    {
        IM_ASSERT(node->Windows.Size > 0);
        ImGuiWindow* ref_window = NULL;
        if (node->SelectedTabId != 0) // Note that we prune single-window-node settings on .ini loading, so this is generally 0 for them!
            ref_window = DockNodeFindWindowByID(node, node->SelectedTabId);
        if (ref_window == NULL)
            ref_window = node->Windows[0];
        if (ref_window->AutoFitFramesX > 0 || ref_window->AutoFitFramesY > 0)
        {
            node->State = ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
            return;
        }
    }

    const ImGuiDockNodeFlags node_flags = node->GetMergedFlags();

    // Bind or create host window
    ImGuiWindow* host_window = NULL;
    bool beginned_into_host_window = false;
    if (node->IsDockSpace())
    {
        // [Explicit root dockspace node]
        IM_ASSERT(node->HostWindow);
        node->EnableCloseButton = false;
        node->HasCloseButton = (node_flags & ImGuiDockNodeFlags_NoCloseButton) == 0;
        node->HasWindowMenuButton = (node_flags & ImGuiDockNodeFlags_NoWindowMenuButton) == 0;
        host_window = node->HostWindow;
    }
    else
    {
        // [Automatic root or child nodes]
        node->EnableCloseButton = false;
        node->HasCloseButton = (node->Windows.Size > 0) && (node_flags & ImGuiDockNodeFlags_NoCloseButton) == 0;
        node->HasWindowMenuButton = (node->Windows.Size > 0) && (node_flags & ImGuiDockNodeFlags_NoWindowMenuButton) == 0;
        for (int window_n = 0; window_n < node->Windows.Size; window_n++)
        {
            // FIXME-DOCK: Setting DockIsActive here means that for single active window in a leaf node, DockIsActive will be cleared until the next Begin() call.
            ImGuiWindow* window = node->Windows[window_n];
            window->DockIsActive = (node->Windows.Size > 1);
            node->EnableCloseButton |= window->HasCloseButton;
        }

        if (node->IsRootNode() && node->IsVisible)
        {
            ImGuiWindow* ref_window = (node->Windows.Size > 0) ? node->Windows[0] : NULL;

            // Sync Pos
            if (node->AuthorityForPos == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowPos(ref_window->Pos);
            else if (node->AuthorityForPos == ImGuiDataAuthority_DockNode)
                SetNextWindowPos(node->Pos);

            // Sync Size
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowSize(ref_window->SizeFull);
            else if (node->AuthorityForSize == ImGuiDataAuthority_DockNode)
                SetNextWindowSize(node->Size);

            // Sync Collapsed
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowCollapsed(ref_window->Collapsed);

            // Sync Viewport
            if (node->AuthorityForViewport == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowViewport(ref_window->ViewportId);

            SetNextWindowClass(&node->WindowClass);

            // Begin into the host window
            char window_label[20];
            DockNodeGetHostWindowTitle(node, window_label, IM_ARRAYSIZE(window_label));
            ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse | ImGuiWindowFlags_DockNodeHost;
            window_flags |= ImGuiWindowFlags_NoFocusOnAppearing;
            window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus | ImGuiWindowFlags_NoCollapse;
            window_flags |= ImGuiWindowFlags_NoTitleBar;

            PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0, 0));
            Begin(window_label, NULL, window_flags);
            PopStyleVar();
            beginned_into_host_window = true;

            node->HostWindow = host_window = g.CurrentWindow;
            host_window->DockNodeAsHost = node;
            host_window->DC.CursorPos = host_window->Pos;
            node->Pos = host_window->Pos;
            node->Size = host_window->Size;

            // We set ImGuiWindowFlags_NoFocusOnAppearing because we don't want the host window to take full focus (e.g. steal NavWindow)
            // But we still it bring it to the front of display. There's no way to choose this precise behavior via window flags.
            // One simple case to ponder if: window A has a toggle to create windows B/C/D. Dock B/C/D together, clear the toggle and enable it again.
            // When reappearing B/C/D will request focus and be moved to the top of the display pile, but they are not linked to the dock host window
            // during the frame they appear. The dock host window would keep its old display order, and the sorting in EndFrame would move B/C/D back
            // after the dock host window, losing their top-most status.
            if (node->HostWindow->Appearing)
                BringWindowToDisplayFront(node->HostWindow);

            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        else if (node->ParentNode)
        {
            node->HostWindow = host_window = node->ParentNode->HostWindow;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        if (node->WantMouseMove && node->HostWindow)
            DockNodeStartMouseMovingWindow(node, node->HostWindow);
    }

    // Update focused node (the one whose title bar is highlight) within a node tree
    if (node->IsSplitNode())
        IM_ASSERT(node->TabBar == NULL);
    if (node->IsRootNode())
        if (g.NavWindow && g.NavWindow->RootWindowDockStop->DockNode && g.NavWindow->RootWindowDockStop->ParentWindow == host_window)
            node->LastFocusedNodeId = g.NavWindow->RootWindowDockStop->DockNode->ID;

    // We need to draw a background at the root level if requested by ImGuiDockNodeFlags_PassthruCentralNode, but we will only know the correct pos/size after
    // processing the resizing splitters. So we are using the DrawList channel splitting facility to submit drawing primitives out of order!
    const bool render_dockspace_bg = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0;
    if (render_dockspace_bg)
    {
        host_window->DrawList->ChannelsSplit(2);
        host_window->DrawList->ChannelsSetCurrent(1);
    }

    // Register a hit-test hole in the window unless we are currently dragging a window that is compatible with our dockspace
    const ImGuiDockNode* central_node = node->CentralNode;
    const bool central_node_hole = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0 && central_node != NULL && central_node->IsEmpty();
    bool central_node_hole_register_hit_test_hole = central_node_hole;
    if (central_node_hole)
        if (const ImGuiPayload* payload = ImGui::GetDragDropPayload())
            if (payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) && DockNodeIsDropAllowed(host_window, *(ImGuiWindow**)payload->Data))
                central_node_hole_register_hit_test_hole = false;
    if (central_node_hole_register_hit_test_hole)
    {
        // Add a little padding to match the "resize from edges" behavior and allow grabbing the splitter easily.
        IM_ASSERT(node->IsDockSpace()); // We cannot pass this flag without the DockSpace() api. Testing this because we also setup the hole in host_window->ParentNode
        ImRect central_hole(central_node->Pos, central_node->Pos + central_node->Size);
        central_hole.Expand(ImVec2(-WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS, -WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS));
        if (central_node_hole && !central_hole.IsInverted())
        {
            SetWindowHitTestHole(host_window, central_hole.Min, central_hole.Max - central_hole.Min);
            SetWindowHitTestHole(host_window->ParentWindow, central_hole.Min, central_hole.Max - central_hole.Min);
        }
    }

    // Update position/size, process and draw resizing splitters
    if (node->IsRootNode() && host_window)
    {
        DockNodeTreeUpdatePosSize(node, host_window->Pos, host_window->Size);
        DockNodeTreeUpdateSplitter(node);
    }

    // Draw empty node background (currently can only be the Central Node)
    if (host_window && node->IsEmpty() && node->IsVisible && !(node_flags & ImGuiDockNodeFlags_PassthruCentralNode))
        host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_DockingEmptyBg));

    // Draw whole dockspace background if ImGuiDockNodeFlags_PassthruCentralNode if set.
    if (render_dockspace_bg && node->IsVisible)
    {
        host_window->DrawList->ChannelsSetCurrent(0);
        if (central_node_hole)
            RenderRectFilledWithHole(host_window->DrawList, node->Rect(), central_node->Rect(), GetColorU32(ImGuiCol_WindowBg), 0.0f);
        else
            host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_WindowBg), 0.0f);
        host_window->DrawList->ChannelsMerge();
    }

    // Draw and populate Tab Bar
    if (host_window && node->Windows.Size > 0)
    {
        DockNodeUpdateTabBar(node, host_window);
    }
    else
    {
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->IsFocused = false;
    }
    if (node->TabBar && node->TabBar->SelectedTabId)
        node->SelectedTabId = node->TabBar->SelectedTabId;
    else if (node->Windows.Size > 0)
        node->SelectedTabId = node->Windows[0]->ID;

    // Draw payload drop target
    if (host_window && node->IsVisible)
        if (node->IsRootNode() && (g.MovingWindow == NULL || g.MovingWindow->RootWindow != host_window))
            BeginDockableDragDropTarget(host_window);

    // We update this after DockNodeUpdateTabBar()
    node->LastFrameActive = g.FrameCount;

    // Recurse into children
    // FIXME-DOCK FIXME-OPT: Should not need to recurse into children
    if (host_window)
    {
        if (node->ChildNodes[0])
            DockNodeUpdate(node->ChildNodes[0]);
        if (node->ChildNodes[1])
            DockNodeUpdate(node->ChildNodes[1]);

        // Render outer borders last (after the tab bar)
        if (node->IsRootNode())
            RenderWindowOuterBorders(host_window);
    }

    // End host window
    if (beginned_into_host_window) //-V1020
        End();
}